

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O2

void __thiscall MD5::encodeFile(MD5 *this,char *filename,qpdf_offset_t up_to_offset)

{
  int iVar1;
  FILE *__stream;
  unsigned_long uVar2;
  size_t sVar3;
  size_t __n;
  ulong uVar4;
  allocator<char> local_491;
  MD5 *local_490;
  qpdf_offset_t up_to_offset_local;
  char *local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  char buffer [1024];
  
  local_490 = this;
  up_to_offset_local = up_to_offset;
  local_480 = filename;
  __stream = (FILE *)QUtil::safe_fopen(filename,"rb");
  if (up_to_offset < 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert(&up_to_offset_local)
    ;
    up_to_offset = up_to_offset_local;
  }
  uVar4 = 0;
  sVar3 = 0x400;
  do {
    __n = uVar2 - uVar4;
    if (sVar3 + uVar4 <= uVar2) {
      __n = sVar3;
    }
    if (up_to_offset < 0) {
      __n = sVar3;
    }
    sVar3 = fread(buffer,1,__n,__stream);
    if (sVar3 == 0) break;
    encodeDataIncrementally(local_490,buffer,sVar3);
    uVar4 = uVar4 + sVar3;
    sVar3 = __n;
    up_to_offset = up_to_offset_local;
  } while ((up_to_offset_local < 0) || (uVar4 < uVar2));
  iVar1 = ferror(__stream);
  if (iVar1 != 0) {
    fclose(__stream);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,"MD5: read error on ",&local_491);
    std::operator+(&local_478,&local_458,local_480);
    QUtil::throw_system_error(&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
  }
  fclose(__stream);
  (*((local_490->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_QPDFCryptoImpl[5])();
  return;
}

Assistant:

void
MD5::encodeFile(char const* filename, qpdf_offset_t up_to_offset)
{
    char buffer[1024];

    FILE* file = QUtil::safe_fopen(filename, "rb");
    size_t len;
    size_t so_far = 0;
    size_t to_try = 1024;
    size_t up_to_size = 0;
    if (up_to_offset >= 0) {
        up_to_size = QIntC::to_size(up_to_offset);
    }
    do {
        if ((up_to_offset >= 0) && ((so_far + to_try) > up_to_size)) {
            to_try = up_to_size - so_far;
        }
        len = fread(buffer, 1, to_try, file);
        if (len > 0) {
            encodeDataIncrementally(buffer, len);
            so_far += len;
            if ((up_to_offset >= 0) && (so_far >= up_to_size)) {
                break;
            }
        }
    } while (len > 0);
    if (ferror(file)) {
        // Assume, perhaps incorrectly, that errno was set by the underlying call to read....
        (void)fclose(file);
        QUtil::throw_system_error(std::string("MD5: read error on ") + filename);
    }
    (void)fclose(file);

    this->crypto->MD5_finalize();
}